

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O0

bool CheckCollapsePath(string *path,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_40 [8];
  string result;
  string *expected_local;
  string *path_local;
  
  result.field_2._8_8_ = expected;
  cmsys::SystemTools::CollapseFullPath((string *)local_40,path);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          result.field_2._8_8_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"CollapseFullPath(");
    poVar2 = std::operator<<(poVar2,(string *)path);
    poVar2 = std::operator<<(poVar2,")  yielded ");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2," instead of ");
    poVar2 = std::operator<<(poVar2,(string *)result.field_2._8_8_);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  path_local._7_1_ = !bVar1;
  std::__cxx11::string::~string((string *)local_40);
  return path_local._7_1_;
}

Assistant:

static bool CheckCollapsePath(
  const kwsys_stl::string& path,
  const kwsys_stl::string& expected)
{
  kwsys_stl::string result = kwsys::SystemTools::CollapseFullPath(path);
  if(expected != result)
    {
    kwsys_ios::cerr << "CollapseFullPath(" << path
      << ")  yielded " << result << " instead of " << expected << kwsys_ios::endl;
    return false;
    }
  return true;
}